

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O2

int Abc_NtkMultiLimit_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,int nFaninMax,int fCanStop,int fFirst)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  bVar8 = fFirst == 0;
  bVar9 = fCanStop == 0;
  bVar7 = false;
  while( true ) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                    ,0x130,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    if ((bVar8) && ((*(uint *)&pNode->field_0x14 & 0x1f) != 7)) break;
    if (!bVar9) {
      if (vCone->nSize != 0) {
        __assert_fail("vCone->nSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                      ,0x13f,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
      }
      iVar3 = Abc_NtkMultiLimit_rec
                        ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone,
                         nFaninMax,1,0);
      iVar6 = 1;
      if (iVar3 == 0) {
        iVar3 = vCone->nSize;
        if (nFaninMax < iVar3) {
          __assert_fail("nNodes0 <= nFaninMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                        ,0x144,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)")
          ;
        }
        Abc_NtkMultiLimit_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vCone,
                   nFaninMax,0,0);
        iVar6 = 0;
        if (nFaninMax < vCone->nSize) {
          vCone->nSize = 0;
          Abc_NtkMultiLimit_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vCone,
                     nFaninMax,0,0);
          if (nFaninMax < vCone->nSize) {
            vCone->nSize = 0;
            iVar3 = Abc_NtkMultiLimit_rec
                              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],
                               vCone,nFaninMax,1,0);
            iVar6 = 1;
            if (iVar3 == 0) {
              __assert_fail("RetValue == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                            ,0x154,
                            "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
            }
          }
          else {
            piVar1 = (pNode->vFanins).pArray;
            ppvVar2 = pNode->pNtk->vObjs->pArray;
            if (iVar3 < vCone->nSize) {
              pvVar4 = ppvVar2[piVar1[1]];
              uVar5 = *(uint *)((long)pvVar4 + 0x14);
              if ((uVar5 & 0x10) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,1)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                              ,0x161,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
            }
            else {
              pvVar4 = ppvVar2[*piVar1];
              uVar5 = *(uint *)((long)pvVar4 + 0x14);
              if ((uVar5 & 0x10) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,0)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                              ,0x15c,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
            }
            *(uint *)((long)pvVar4 + 0x14) = uVar5 | 0x10;
            iVar6 = 1;
          }
        }
      }
      goto LAB_0025d6d1;
    }
    Abc_NtkMultiLimit_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone,nFaninMax,0,0
              );
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
    bVar9 = true;
    bVar8 = true;
    bVar7 = true;
  }
  Vec_PtrPushUnique(vCone,pNode);
  iVar6 = 0;
LAB_0025d6d1:
  iVar3 = 0;
  if (!bVar7) {
    iVar3 = iVar6;
  }
  return iVar3;
}

Assistant:

int Abc_NtkMultiLimit_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, int nFaninMax, int fCanStop, int fFirst )
{
    int nNodes0, nNodes1;
    assert( !Abc_ObjIsComplement(pNode) );
    // check if the node should be added to the fanins
    if ( !fFirst && (pNode->fMarkA || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return 0;
    }
    // if we cannot stop in this branch, collect all nodes
    if ( !fCanStop )
    {
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 0, 0 );
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
        return 0;
    }
    // if we can stop, try the left branch first, and return if we stopped
    assert( vCone->nSize == 0 );
    if ( Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 1, 0 ) )
        return 1;
    // save the number of nodes in the left branch and call for the right branch
    nNodes0 = vCone->nSize;
    assert( nNodes0 <= nFaninMax );
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // check the number of nodes
    if ( vCone->nSize <= nFaninMax )
        return 0;
    // the number of nodes exceeds the limit

    // get the number of nodes in the right branch
    vCone->nSize = 0;
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // if this number exceeds the limit, solve the problem for this branch
    if ( vCone->nSize > nFaninMax )
    {
        int RetValue;
        vCone->nSize = 0;
        RetValue = Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 1, 0 );
        assert( RetValue == 1 );
        return 1;
    }

    nNodes1 = vCone->nSize; 
    assert( nNodes1 <= nFaninMax );
    if ( nNodes0 >= nNodes1 )
    { // the left branch is larger - cut it
        assert( Abc_ObjFanin(pNode,0)->fMarkA == 0 );
        Abc_ObjFanin(pNode,0)->fMarkA = 1;
    }
    else
    { // the right branch is larger - cut it
        assert( Abc_ObjFanin(pNode,1)->fMarkA == 0 );
        Abc_ObjFanin(pNode,1)->fMarkA = 1;
    }
    return 1;
}